

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_basics.cpp
# Opt level: O0

void set_inter_deferred(Am_Object *inter,Am_Input_Event *ev,Am_Object *event_window,Am_Object *obj,
                       Am_Input_Char deferring)

{
  Deferred_Event_Holder *this;
  Am_Object local_58 [3];
  Deferred_Event_Holder *local_40;
  Deferred_Event_Holder *holder;
  Am_Object *pAStack_30;
  Am_Input_Char want_ic;
  Am_Object *obj_local;
  Am_Object *event_window_local;
  Am_Input_Event *ev_local;
  Am_Object *inter_local;
  Am_Input_Char deferring_local;
  
  holder._4_4_ = deferring;
  pAStack_30 = obj;
  this = (Deferred_Event_Holder *)operator_new(0x30);
  Deferred_Event_Holder::Deferred_Event_Holder(this);
  local_40 = this;
  Am_Object::operator=((Am_Object *)this,inter);
  Am_Object::operator=(&local_40->obj,pAStack_30);
  Am_Input_Char::operator=(&local_40->want_ic,(Am_Input_Char *)((long)&holder + 4));
  Am_Input_Char::operator=(&local_40->got_ic,&ev->input_char);
  local_40->x = ev->x;
  local_40->y = ev->y;
  Am_Object::operator=(&local_40->event_window,event_window);
  local_40->next = Am_List_Of_Deferred_Events;
  Am_List_Of_Deferred_Events = local_40;
  Am_Object::Am_Object(local_58,event_window);
  set_want_move_one_win(local_58,true);
  Am_Object::~Am_Object(local_58);
  return;
}

Assistant:

static void
set_inter_deferred(Am_Object &inter, Am_Input_Event *ev,
                   Am_Object &event_window, Am_Object &obj,
                   Am_Input_Char deferring)
{
  Am_Input_Char want_ic = deferring;
  Deferred_Event_Holder *holder = new Deferred_Event_Holder;
  holder->inter = inter;
  holder->obj = obj;
  holder->want_ic = want_ic;
  holder->got_ic = ev->input_char;
  holder->x = ev->x;
  holder->y = ev->y;
  holder->event_window = event_window;
  holder->next = Am_List_Of_Deferred_Events;
  Am_List_Of_Deferred_Events = holder;
  Am_INTER_TRACE_PRINT(inter, "Adding " << inter << " to deferred list");
  //turn on mouse moved
  set_want_move_one_win(event_window, true);
}